

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O1

void msdfgen::generatePseudoSDF
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  SignedDistance b;
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  EdgeSegment *pEVar5;
  float *pfVar6;
  ulong uVar7;
  EdgeHolder *this;
  pointer this_00;
  uint uVar8;
  pointer pCVar9;
  uint uVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  Vector2 VVar16;
  SignedDistance a;
  vector<int,_std::allocator<int>_> windings;
  vector<double,_std::allocator<double>_> contourSD;
  double param;
  SignedDistance local_140;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  vector<int,_std::allocator<int>_> local_f8;
  ulong local_e0;
  double local_d8;
  uint local_d0;
  int local_cc;
  vector<double,_std::allocator<double>_> local_c8;
  Shape *local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  Bitmap<float> *local_80;
  Vector2 *local_78;
  Vector2 *local_70;
  ulong local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  Vector2 local_40;
  
  uVar10 = (int)((long)(shape->contours).
                       super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(shape->contours).
                       super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_88 = range;
  local_78 = translate;
  local_70 = scale;
  local_12c = Bitmap<float>::width(output);
  local_80 = output;
  uVar3 = Bitmap<float>::height(output);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&local_f8,(long)(int)uVar10);
  pCVar9 = (shape->contours).super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pCVar9 != (shape->contours).
                super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      iVar4 = Contour::winding(pCVar9);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
      if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_c8);
      }
      else {
        *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar4;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      pCVar9 = pCVar9 + 1;
    } while (pCVar9 != (shape->contours).
                       super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_c8,(long)(int)uVar10);
  if (0 < (int)uVar3) {
    local_e0 = (ulong)(uVar10 & 0x7fffffff);
    uVar7 = 0;
    local_a8 = shape;
    do {
      uVar8 = (uint)uVar7;
      local_d0 = ~uVar8 + uVar3;
      if (shape->inverseYAxis == false) {
        local_d0 = uVar8;
      }
      if (0 < local_12c) {
        local_60 = (double)(int)uVar8 + 0.5;
        local_68 = uVar7;
        iVar4 = 0;
        do {
          local_cc = iVar4;
          Vector2::Vector2(&local_40,(double)local_cc + 0.5,local_60);
          VVar16 = Vector2::operator/(&local_40,local_70);
          local_140.dot = VVar16.y;
          local_140.distance = VVar16.x;
          VVar16 = Vector2::operator-((Vector2 *)&local_140,local_78);
          local_a0 = VVar16.y;
          local_98 = VVar16.x;
          local_108 = 1e+240;
          uStack_100 = 0x8000000000000000;
          local_118 = -1e+240;
          uStack_110 = 0;
          if ((int)uVar10 < 1) {
            iVar4 = 0;
          }
          else {
            pCVar9 = (shape->contours).
                     super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl
                     .super__Vector_impl_data._M_start;
            uVar7 = 0;
            local_58 = -1e+240;
            uStack_50 = 0;
            iVar4 = 0;
            do {
              SignedDistance::SignedDistance(&local_140);
              this_00 = *(pointer *)
                         &(pCVar9->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
              ;
              if (this_00 ==
                  (pCVar9->edges).
                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                local_d8 = 0.0;
                this = (EdgeHolder *)0x0;
              }
              else {
                local_d8 = 0.0;
                this = (EdgeHolder *)0x0;
                do {
                  pEVar5 = EdgeHolder::operator->(this_00);
                  dVar15 = local_a0;
                  (*pEVar5->_vptr_EdgeSegment[5])(SUB84(local_98,0),pEVar5,&local_40);
                  b.dot = local_140.dot;
                  b.distance = local_140.distance;
                  local_128 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                  a.dot = dVar15;
                  a.distance = local_128;
                  local_90 = dVar15;
                  bVar2 = operator<(a,b);
                  if (bVar2) {
                    local_140.distance = local_128;
                    local_140.dot = local_90;
                    local_d8 = local_40.x;
                    this = this_00;
                  }
                  this_00 = this_00 + 1;
                } while (this_00 !=
                         (pCVar9->edges).
                         super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              if (ABS(local_140.distance) < ABS(local_58)) {
                iVar4 = -local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar7];
                local_58 = local_140.distance;
                uStack_50 = 0;
              }
              if (this != (EdgeHolder *)0x0) {
                pEVar5 = EdgeHolder::operator->(this);
                (*pEVar5->_vptr_EdgeSegment[6])
                          (SUB84(local_98,0),local_a0,local_d8,pEVar5,&local_140);
              }
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7] = local_140.distance;
              if (((0 < local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7]) && (0.0 <= local_140.distance)) &&
                 (ABS(local_140.distance) < ABS(local_118))) {
                local_118 = local_140.distance;
                uStack_110 = 0;
              }
              if (((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7] < 0) && (local_140.distance <= 0.0)) &&
                 (ABS(local_140.distance) < ABS(local_108))) {
                local_108 = local_140.distance;
                uStack_100 = 0;
              }
              uVar7 = uVar7 + 1;
              pCVar9 = pCVar9 + 1;
            } while (uVar7 != local_e0);
          }
          shape = local_a8;
          iVar1 = local_cc;
          local_128 = -1e+240;
          uStack_120 = 0;
          if ((local_118 < 0.0) || (ABS(local_108) < ABS(local_118))) {
            if (local_108 <= 0.0) {
              if (ABS(local_108) <= ABS(local_118)) {
                local_128 = local_108;
                uStack_120 = uStack_100;
                iVar4 = -1;
                if (0 < (int)uVar10) {
                  uVar7 = 0;
                  do {
                    if (((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7] < 0) &&
                        (dVar15 = local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar7],
                        dVar15 < local_108)) && (ABS(dVar15) < ABS(local_118))) {
                      uStack_100 = 0;
                      local_108 = dVar15;
                    }
                    uVar7 = uVar7 + 1;
                  } while (local_e0 != uVar7);
                  iVar4 = -1;
                  uVar11 = (undefined4)local_108;
                  uVar12 = local_108._4_4_;
                  uVar13 = (undefined4)uStack_100;
                  uVar14 = uStack_100._4_4_;
                  goto LAB_00166bc3;
                }
              }
            }
          }
          else {
            iVar4 = 1;
            if (0 < (int)uVar10) {
              uVar7 = 0;
              do {
                if (((0 < local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar7]) &&
                    (dVar15 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7], local_118 < dVar15)) &&
                   (ABS(dVar15) < ABS(local_108))) {
                  uStack_110 = 0;
                  local_118 = dVar15;
                }
                uVar7 = uVar7 + 1;
              } while (local_e0 != uVar7);
            }
            uVar11 = (undefined4)local_118;
            uVar12 = local_118._4_4_;
            uVar13 = (undefined4)uStack_110;
            uVar14 = uStack_110._4_4_;
LAB_00166bc3:
            local_128 = (double)CONCAT44(uVar12,uVar11);
            uStack_120 = CONCAT44(uVar14,uVar13);
          }
          if (0 < (int)uVar10) {
            uVar7 = 0;
            do {
              if ((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7] != iVar4) &&
                 (ABS(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7]) < ABS(local_128))) {
                uStack_120 = 0;
                local_128 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7];
              }
              uVar7 = uVar7 + 1;
            } while (local_e0 != uVar7);
          }
          pfVar6 = Bitmap<float>::operator()(local_80,local_cc,local_d0);
          *pfVar6 = (float)(local_128 / local_88 + 0.5);
          uVar7 = local_68;
          iVar4 = iVar1 + 1;
        } while (iVar1 + 1 != local_12c);
      }
      uVar8 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar8;
    } while (uVar8 != uVar3);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generatePseudoSDF(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<double> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;
                double sd = SignedDistance::INFINITE.distance;
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge = NULL;
                    double nearParam = 0;
                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if (distance < minDistance) {
                            minDistance = distance;
                            nearEdge = &*edge;
                            nearParam = param;
                        }
                    }
                    if (fabs(minDistance.distance) < fabs(sd)) {
                        sd = minDistance.distance;
                        winding = -windings[i];
                    }
                    if (nearEdge)
                        (*nearEdge)->distanceToPseudoDistance(minDistance, p, nearParam);
                    contourSD[i] = minDistance.distance;
                    if (windings[i] > 0 && minDistance.distance >= 0 && fabs(minDistance.distance) < fabs(posDist))
                        posDist = minDistance.distance;
                    if (windings[i] < 0 && minDistance.distance <= 0 && fabs(minDistance.distance) < fabs(negDist))
                        negDist = minDistance.distance;
                }

                double psd = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    psd = posDist;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i] > psd && fabs(contourSD[i]) < fabs(negDist))
                            psd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    psd = negDist;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i] < psd && fabs(contourSD[i]) < fabs(posDist))
                            psd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i]) < fabs(psd))
                        psd = contourSD[i];

                output(x, row) = float(psd/range+.5);
            }
        }
    }
}